

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf271.c
# Opt level: O1

INT64 calculate_op(YMF271Chip *chip,int slotnum,INT64 inp)

{
  double dVar1;
  byte bVar2;
  UINT8 UVar3;
  short sVar4;
  UINT32 UVar5;
  int iVar6;
  long lVar7;
  UINT64 UVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  
  update_envelope(chip->slots + slotnum);
  uVar9 = chip->slots[slotnum].lfo_phase + chip->slots[slotnum].lfo_step;
  UVar5 = chip->slots[slotnum].fns;
  chip->slots[slotnum].lfo_phase = uVar9;
  bVar2 = chip->slots[slotnum].lfowave;
  uVar9 = uVar9 >> 8 & 0xff;
  iVar11 = chip->lut_alfo[bVar2][uVar9];
  chip->slots[slotnum].lfo_amplitude = iVar11;
  dVar1 = chip->lut_plfo[bVar2][chip->slots[slotnum].pms][uVar9];
  chip->slots[slotnum].lfo_phasemod = dVar1;
  uVar10 = (ulong)chip->slots[slotnum].waveform;
  uVar9 = UVar5 * 2;
  if (uVar10 == 7) {
    dVar13 = (double)(uVar9 | 0x1000) * pow_table[chip->slots[slotnum].block] *
             fs_frequency[chip->slots[slotnum].fs] * multiple_table[chip->slots[slotnum].multiple];
    dVar14 = 0.125;
  }
  else {
    dVar13 = (double)uVar9 * pow_table[chip->slots[slotnum].block] *
             multiple_table[chip->slots[slotnum].multiple] * 1024.0;
    dVar14 = 0.0001220703125;
  }
  chip->slots[slotnum].step = (UINT32)(long)(dVar1 * dVar13 * dVar14);
  UVar3 = chip->slots[slotnum].ams;
  if (UVar3 == '\x03') {
    iVar11 = iVar11 * 0x10b5;
  }
  else if (UVar3 == '\x02') {
    iVar11 = iVar11 * 0x4166;
  }
  else {
    uVar9 = 0x10000;
    if (UVar3 != '\x01') goto LAB_0015bedc;
    iVar11 = iVar11 * 0x8164;
  }
  uVar9 = 0x10000 - (iVar11 >> 0x10);
LAB_0015bedc:
  iVar11 = chip->lut_env_volume[0xff - *(short *)((long)&chip->slots[slotnum].volume + 2)];
  iVar6 = chip->lut_total_level[chip->slots[slotnum].tl];
  if (inp == -2) {
    iVar12 = 0;
  }
  else if (inp == -1) {
    lVar7 = chip->slots[slotnum].feedback_modulation1;
    iVar12 = (int)((chip->slots[slotnum].feedback_modulation0 + lVar7) / 2);
    chip->slots[slotnum].feedback_modulation0 = lVar7;
  }
  else {
    iVar12 = (int)inp * modulation_level[chip->slots[slotnum].feedback] * 0x100;
  }
  UVar8 = chip->slots[slotnum].stepptr;
  sVar4 = *(short *)((long)chip->lut_waves[uVar10] +
                    (ulong)((uint)(iVar12 + (int)UVar8) >> 0xf & 0x7fe));
  chip->slots[slotnum].stepptr = chip->slots[slotnum].step + UVar8;
  return (long)sVar4 * (long)(int)((long)iVar6 * ((long)iVar11 * (ulong)uVar9 >> 0x10) >> 0x10) >>
         0x10;
}

Assistant:

static INT64 calculate_op(YMF271Chip *chip, int slotnum, INT64 inp)
{
	YMF271Slot *slot = &chip->slots[slotnum];
	INT64 env, slot_output, slot_input = 0;

	update_envelope(slot);
	update_lfo(chip, slot);
	env = calculate_slot_volume(chip, slot);

	if (inp == OP_INPUT_FEEDBACK)
	{
		// from own feedback
		slot_input = (slot->feedback_modulation0 + slot->feedback_modulation1) / 2;
		slot->feedback_modulation0 = slot->feedback_modulation1;
	}
	else if (inp != OP_INPUT_NONE)
	{
		// from previous slot output
		slot_input = ((inp << (SIN_BITS-2)) * modulation_level[slot->feedback]);
	}

	slot_output = chip->lut_waves[slot->waveform][((slot->stepptr + slot_input) >> 16) & SIN_MASK];
	slot_output = (slot_output * env) >> 16;
	slot->stepptr += slot->step;

	return slot_output;
}